

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seose_compat.cpp
# Opt level: O2

string * seose_to_base62_abi_cxx11_(string *__return_storage_ptr__,uint16_t input)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (; input != 0; input = input / 0x3e) {
    std::operator+(&bStack_48,
                   "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[input % 0x3e],
                   __return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string seose_to_base62(std::uint16_t input)
{
	static char dict[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

	std::string result;

	while (input > 0)
	{
		std::uint16_t x = input % 62;
		input /= 62;
		result = dict[x] + result;
	}

	return result;
}